

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderDerivateTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::LinearDerivateCase::init(LinearDerivateCase *this,EVP_PKEY_CTX *ctx)

{
  float fVar1;
  float fVar2;
  float fVar3;
  Precision PVar4;
  int i;
  int extraout_EAX;
  RenderTarget *pRVar5;
  char *pcVar6;
  mapped_type *pmVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  DataType DVar12;
  Precision precision;
  char *pcVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  Vec4 dx;
  Vector<float,_4> res_2;
  Vector<float,_4> res_8;
  Vec4 dy;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  fragmentParams;
  Vector<float,_4> res_7;
  Vector<float,_4> res_6;
  undefined1 local_108 [8];
  undefined8 uStack_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  float local_e0;
  float local_dc;
  undefined1 local_d8 [8];
  undefined8 uStack_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  float local_b8 [4];
  StringTemplate local_a8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_88;
  float local_58 [10];
  
  if ((this->super_TriangleDerivateCase).m_surfaceType == SURFACETYPE_DEFAULT_FRAMEBUFFER) {
    pRVar5 = Context::getRenderTarget((this->super_TriangleDerivateCase).super_TestCase.m_context);
    iVar11 = 0xa7;
    if (pRVar5->m_width < 0xa7) {
      iVar11 = pRVar5->m_width;
    }
    pRVar5 = Context::getRenderTarget((this->super_TriangleDerivateCase).super_TestCase.m_context);
    iVar10 = 0x67;
    if (pRVar5->m_height < 0x67) {
      iVar10 = pRVar5->m_height;
    }
    local_e0 = (float)iVar11;
    local_dc = (float)iVar10;
  }
  else {
    local_dc = 133.0;
    local_e0 = 99.0;
  }
  PVar4 = (this->super_TriangleDerivateCase).m_surfaceType;
  local_88._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_88._M_impl.super__Rb_tree_header._M_header;
  local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
  DVar12 = TYPE_FLOAT_VEC4;
  if (PVar4 == PRECISION_HIGHP) {
    DVar12 = TYPE_UINT_VEC4;
  }
  local_88._M_impl.super__Rb_tree_header._M_header._M_right =
       local_88._M_impl.super__Rb_tree_header._M_header._M_left;
  pcVar6 = glu::getDataTypeName(DVar12);
  local_108 = (undefined1  [8])&local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"OUTPUT_TYPE","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_88,(key_type *)local_108);
  pcVar13 = (char *)pmVar7->_M_string_length;
  strlen(pcVar6);
  std::__cxx11::string::_M_replace((ulong)pmVar7,0,pcVar13,(ulong)pcVar6);
  if (local_108 != (undefined1  [8])&local_f8) {
    operator_delete((void *)local_108,local_f8._M_allocated_capacity + 1);
  }
  precision = PVar4;
  if (PVar4 != PRECISION_HIGHP) {
    precision = (this->super_TriangleDerivateCase).m_precision;
  }
  pcVar6 = glu::getPrecisionName(precision);
  local_108 = (undefined1  [8])&local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"OUTPUT_PREC","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_88,(key_type *)local_108);
  pcVar13 = (char *)pmVar7->_M_string_length;
  strlen(pcVar6);
  std::__cxx11::string::_M_replace((ulong)pmVar7,0,pcVar13,(ulong)pcVar6);
  if (local_108 != (undefined1  [8])&local_f8) {
    operator_delete((void *)local_108,local_f8._M_allocated_capacity + 1);
  }
  pcVar6 = glu::getPrecisionName((this->super_TriangleDerivateCase).m_precision);
  local_108 = (undefined1  [8])&local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"PRECISION","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_88,(key_type *)local_108);
  pcVar13 = (char *)pmVar7->_M_string_length;
  strlen(pcVar6);
  std::__cxx11::string::_M_replace((ulong)pmVar7,0,pcVar13,(ulong)pcVar6);
  if (local_108 != (undefined1  [8])&local_f8) {
    operator_delete((void *)local_108,local_f8._M_allocated_capacity + 1);
  }
  pcVar6 = glu::getDataTypeName((this->super_TriangleDerivateCase).m_dataType);
  local_108 = (undefined1  [8])&local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"DATATYPE","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_88,(key_type *)local_108);
  pcVar13 = (char *)pmVar7->_M_string_length;
  strlen(pcVar6);
  std::__cxx11::string::_M_replace((ulong)pmVar7,0,pcVar13,(ulong)pcVar6);
  if (local_108 != (undefined1  [8])&local_f8) {
    operator_delete((void *)local_108,local_f8._M_allocated_capacity + 1);
  }
  uVar8 = (ulong)*(uint *)&(this->super_TriangleDerivateCase).field_0xf4;
  if (uVar8 < 3) {
    pcVar13 = (&PTR_anon_var_dwarf_243f9bc_0218cef8)[uVar8];
  }
  else {
    pcVar13 = (char *)0x0;
  }
  local_108 = (undefined1  [8])&local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"FUNC","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_88,(key_type *)local_108);
  pcVar6 = (char *)pmVar7->_M_string_length;
  strlen(pcVar13);
  std::__cxx11::string::_M_replace((ulong)pmVar7,0,pcVar6,(ulong)pcVar13);
  if (local_108 != (undefined1  [8])&local_f8) {
    operator_delete((void *)local_108,local_f8._M_allocated_capacity + 1);
  }
  DVar12 = (this->super_TriangleDerivateCase).m_dataType;
  if (PVar4 == PRECISION_HIGHP) {
    if (DVar12 == TYPE_FLOAT_VEC3) {
      pcVar13 = "floatBitsToUint(vec4(res, 1.0))";
    }
    else if (DVar12 == TYPE_FLOAT_VEC4) {
      pcVar13 = "floatBitsToUint(res)";
    }
    else {
      pcVar13 = "floatBitsToUint(vec4(res, 0.0, 0.0, 1.0))";
      if (DVar12 == TYPE_FLOAT_VEC2) {
        pcVar13 = "floatBitsToUint(vec4(res, 0.0, 1.0))";
      }
    }
    local_108 = (undefined1  [8])&local_f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"CAST_TO_OUTPUT","");
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_88,(key_type *)local_108);
    pcVar6 = (char *)pmVar7->_M_string_length;
    strlen(pcVar13);
    std::__cxx11::string::_M_replace((ulong)pmVar7,0,pcVar6,(ulong)pcVar13);
  }
  else {
    if (DVar12 == TYPE_FLOAT_VEC3) {
      pcVar13 = "vec4(res, 1.0)";
    }
    else if (DVar12 == TYPE_FLOAT_VEC4) {
      pcVar13 = "res";
    }
    else {
      pcVar13 = "vec4(res, 0.0, 0.0, 1.0)";
      if (DVar12 == TYPE_FLOAT_VEC2) {
        pcVar13 = "vec4(res, 0.0, 1.0)";
      }
    }
    local_108 = (undefined1  [8])&local_f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"CAST_TO_OUTPUT","");
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_88,(key_type *)local_108);
    pcVar6 = (char *)pmVar7->_M_string_length;
    strlen(pcVar13);
    std::__cxx11::string::_M_replace((ulong)pmVar7,0,pcVar6,(ulong)pcVar13);
  }
  if (local_108 != (undefined1  [8])&local_f8) {
    operator_delete((void *)local_108,local_f8._M_allocated_capacity + 1);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_d8,(this->m_fragmentTmpl)._M_dataplus._M_p,(allocator<char> *)local_b8)
  ;
  tcu::StringTemplate::StringTemplate(&local_a8,(string *)local_d8);
  tcu::StringTemplate::specialize
            ((string *)local_108,&local_a8,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_88);
  std::__cxx11::string::operator=
            ((string *)&(this->super_TriangleDerivateCase).m_fragmentSrc,(string *)local_108);
  if (local_108 != (undefined1  [8])&local_f8) {
    operator_delete((void *)local_108,local_f8._M_allocated_capacity + 1);
  }
  tcu::StringTemplate::~StringTemplate(&local_a8);
  if (local_d8 != (undefined1  [8])&local_c8) {
    operator_delete((void *)local_d8,local_c8._M_allocated_capacity + 1);
  }
  uVar8 = (ulong)(this->super_TriangleDerivateCase).m_precision;
  if (uVar8 < 3) {
    fVar14 = *(float *)(&DAT_01c5487c + uVar8 * 4);
    fVar15 = *(float *)(&DAT_01c54888 + uVar8 * 4);
    fVar16 = *(float *)(&DAT_01c54894 + uVar8 * 4);
    fVar17 = *(float *)(&DAT_01c548a0 + uVar8 * 4);
    fVar1 = *(float *)(&DAT_01c548ac + uVar8 * 4);
    fVar2 = *(float *)(&DAT_01c548b8 + uVar8 * 4);
    fVar3 = *(float *)(&DAT_01c548c4 + uVar8 * 4);
    (this->super_TriangleDerivateCase).m_coordMin.m_data[0] = *(float *)(&DAT_01c54870 + uVar8 * 4);
    (this->super_TriangleDerivateCase).m_coordMin.m_data[1] = fVar14;
    (this->super_TriangleDerivateCase).m_coordMin.m_data[2] = fVar15;
    (this->super_TriangleDerivateCase).m_coordMin.m_data[3] = fVar16;
    (this->super_TriangleDerivateCase).m_coordMax.m_data[0] = fVar17;
    (this->super_TriangleDerivateCase).m_coordMax.m_data[1] = fVar1;
    (this->super_TriangleDerivateCase).m_coordMax.m_data[2] = fVar2;
    (this->super_TriangleDerivateCase).m_coordMax.m_data[3] = fVar3;
  }
  if ((this->super_TriangleDerivateCase).m_surfaceType == SURFACETYPE_FLOAT_FBO) {
    lVar9 = 0;
    do {
      *(undefined4 *)(local_108 + lVar9 * 4) = 0x3f800000;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 4);
    fVar14 = (float)local_108._0_4_;
    fVar15 = (float)local_108._4_4_;
    fVar16 = (float)uStack_100;
    fVar17 = uStack_100._4_4_;
  }
  else {
    local_a8.m_template._M_dataplus._M_p = (pointer)0x0;
    local_a8.m_template._M_string_length = 0;
    lVar9 = 0;
    do {
      *(float *)((long)&local_a8.m_template._M_dataplus._M_p + lVar9 * 4) =
           (this->super_TriangleDerivateCase).m_coordMax.m_data[lVar9] -
           (this->super_TriangleDerivateCase).m_coordMin.m_data[lVar9];
      lVar9 = lVar9 + 1;
    } while (lVar9 != 4);
    local_d8._4_4_ = local_e0;
    local_d8._0_4_ = local_e0;
    uStack_d0 = CONCAT44(local_e0 * -0.5,local_e0 * 0.5);
    local_108 = (undefined1  [8])0x0;
    uStack_100 = 0;
    lVar9 = 0;
    do {
      *(float *)(local_108 + lVar9 * 4) =
           *(float *)((long)&local_a8.m_template._M_dataplus._M_p + lVar9 * 4) /
           *(float *)(local_d8 + lVar9 * 4);
      lVar9 = lVar9 + 1;
    } while (lVar9 != 4);
    local_d8 = (undefined1  [8])0x0;
    uStack_d0 = 0;
    lVar9 = 0;
    do {
      *(float *)(local_d8 + lVar9 * 4) =
           (this->super_TriangleDerivateCase).m_coordMax.m_data[lVar9] -
           (this->super_TriangleDerivateCase).m_coordMin.m_data[lVar9];
      lVar9 = lVar9 + 1;
    } while (lVar9 != 4);
    local_b8[1] = local_dc;
    local_b8[0] = local_dc;
    local_b8[3] = local_dc * -0.5;
    local_b8[2] = local_dc * 0.5;
    local_a8.m_template._M_dataplus._M_p = (pointer)0x0;
    local_a8.m_template._M_string_length = 0;
    lVar9 = 0;
    do {
      *(float *)((long)&local_a8.m_template._M_dataplus._M_p + lVar9 * 4) =
           *(float *)(local_d8 + lVar9 * 4) / local_b8[lVar9];
      lVar9 = lVar9 + 1;
    } while (lVar9 != 4);
    iVar11 = *(int *)&(this->super_TriangleDerivateCase).field_0xf4;
    if (iVar11 == 2) {
      local_58[4] = 0.0;
      local_58[5] = 0.0;
      local_58[6] = 0.0;
      local_58[7] = 0.0;
      lVar9 = 0;
      do {
        fVar14 = *(float *)(local_108 + lVar9 * 4);
        fVar15 = -fVar14;
        if (-fVar14 <= fVar14) {
          fVar15 = fVar14;
        }
        local_58[lVar9 + 4] = fVar15;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 4);
      local_58[0] = 0.0;
      local_58[1] = 0.0;
      local_58[2] = 0.0;
      local_58[3] = 0.0;
      lVar9 = 0;
      do {
        fVar14 = *(float *)((long)&local_a8.m_template._M_dataplus._M_p + lVar9 * 4);
        fVar15 = -fVar14;
        if (-fVar14 <= fVar14) {
          fVar15 = fVar14;
        }
        local_58[lVar9] = fVar15;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 4);
      local_b8[0] = 0.0;
      local_b8[1] = 0.0;
      local_b8[2] = 0.0;
      local_b8[3] = 0.0;
      lVar9 = 0;
      do {
        local_b8[lVar9] = local_58[lVar9 + 4] + local_58[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar9 != 4);
      local_d8 = (undefined1  [8])0x0;
      uStack_d0 = 0;
      lVar9 = 0;
      do {
        *(float *)(local_d8 + lVar9 * 4) = 0.5 / local_b8[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar9 != 4);
    }
    else if (iVar11 == 1) {
      local_d8 = (undefined1  [8])0x0;
      uStack_d0 = 0;
      lVar9 = 0;
      do {
        *(float *)(local_d8 + lVar9 * 4) =
             0.5 / *(float *)((long)&local_a8.m_template._M_dataplus._M_p + lVar9 * 4);
        lVar9 = lVar9 + 1;
      } while (lVar9 != 4);
    }
    else {
      if (iVar11 != 0) goto LAB_0127cef5;
      local_d8 = (undefined1  [8])0x0;
      uStack_d0 = 0;
      lVar9 = 0;
      do {
        *(float *)(local_d8 + lVar9 * 4) = 0.5 / *(float *)(local_108 + lVar9 * 4);
        lVar9 = lVar9 + 1;
      } while (lVar9 != 4);
    }
    fVar14 = (float)local_d8._0_4_;
    fVar15 = (float)local_d8._4_4_;
    fVar16 = (float)uStack_d0;
    fVar17 = uStack_d0._4_4_;
  }
  (this->super_TriangleDerivateCase).m_derivScale.m_data[0] = fVar14;
  (this->super_TriangleDerivateCase).m_derivScale.m_data[1] = fVar15;
  (this->super_TriangleDerivateCase).m_derivScale.m_data[2] = fVar16;
  (this->super_TriangleDerivateCase).m_derivScale.m_data[3] = fVar17;
LAB_0127cef5:
  (this->super_TriangleDerivateCase).m_derivBias.m_data[0] = 0.0;
  (this->super_TriangleDerivateCase).m_derivBias.m_data[1] = 0.0;
  (this->super_TriangleDerivateCase).m_derivBias.m_data[2] = 0.0;
  (this->super_TriangleDerivateCase).m_derivBias.m_data[3] = 0.0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_88);
  return extraout_EAX;
}

Assistant:

void LinearDerivateCase::init (void)
{
	const tcu::IVec2	viewportSize	= getViewportSize();
	const float			w				= float(viewportSize.x());
	const float			h				= float(viewportSize.y());
	const bool			packToInt		= m_surfaceType == SURFACETYPE_FLOAT_FBO;
	map<string, string>	fragmentParams;

	fragmentParams["OUTPUT_TYPE"]		= glu::getDataTypeName(packToInt ? glu::TYPE_UINT_VEC4 : glu::TYPE_FLOAT_VEC4);
	fragmentParams["OUTPUT_PREC"]		= glu::getPrecisionName(packToInt ? glu::PRECISION_HIGHP : m_precision);
	fragmentParams["PRECISION"]			= glu::getPrecisionName(m_precision);
	fragmentParams["DATATYPE"]			= glu::getDataTypeName(m_dataType);
	fragmentParams["FUNC"]				= getDerivateFuncName(m_func);

	if (packToInt)
	{
		fragmentParams["CAST_TO_OUTPUT"]	= m_dataType == glu::TYPE_FLOAT_VEC4 ? "floatBitsToUint(res)" :
											  m_dataType == glu::TYPE_FLOAT_VEC3 ? "floatBitsToUint(vec4(res, 1.0))" :
											  m_dataType == glu::TYPE_FLOAT_VEC2 ? "floatBitsToUint(vec4(res, 0.0, 1.0))" :
											  /* TYPE_FLOAT */					   "floatBitsToUint(vec4(res, 0.0, 0.0, 1.0))";
	}
	else
	{
		fragmentParams["CAST_TO_OUTPUT"]	= m_dataType == glu::TYPE_FLOAT_VEC4 ? "res" :
											  m_dataType == glu::TYPE_FLOAT_VEC3 ? "vec4(res, 1.0)" :
											  m_dataType == glu::TYPE_FLOAT_VEC2 ? "vec4(res, 0.0, 1.0)" :
											  /* TYPE_FLOAT */					   "vec4(res, 0.0, 0.0, 1.0)";
	}

	m_fragmentSrc = tcu::StringTemplate(m_fragmentTmpl.c_str()).specialize(fragmentParams);

	switch (m_precision)
	{
		case glu::PRECISION_HIGHP:
			m_coordMin = tcu::Vec4(-97.f, 0.2f, 71.f, 74.f);
			m_coordMax = tcu::Vec4(-13.2f, -77.f, 44.f, 76.f);
			break;

		case glu::PRECISION_MEDIUMP:
			m_coordMin = tcu::Vec4(-37.0f, 47.f, -7.f, 0.0f);
			m_coordMax = tcu::Vec4(-1.0f, 12.f, 7.f, 19.f);
			break;

		case glu::PRECISION_LOWP:
			m_coordMin = tcu::Vec4(0.0f, -1.0f, 0.0f, 1.0f);
			m_coordMax = tcu::Vec4(1.0f, 1.0f, -1.0f, -1.0f);
			break;

		default:
			DE_ASSERT(false);
	}

	if (m_surfaceType == SURFACETYPE_FLOAT_FBO)
	{
		// No scale or bias used for accuracy.
		m_derivScale	= tcu::Vec4(1.0f);
		m_derivBias		= tcu::Vec4(0.0f);
	}
	else
	{
		// Compute scale - bias that normalizes to 0..1 range.
		const tcu::Vec4 dx = (m_coordMax - m_coordMin) / tcu::Vec4(w, w, w*0.5f, -w*0.5f);
		const tcu::Vec4 dy = (m_coordMax - m_coordMin) / tcu::Vec4(h, h, h*0.5f, -h*0.5f);

		switch (m_func)
		{
			case DERIVATE_DFDX:
				m_derivScale = 0.5f / dx;
				break;

			case DERIVATE_DFDY:
				m_derivScale = 0.5f / dy;
				break;

			case DERIVATE_FWIDTH:
				m_derivScale = 0.5f / (tcu::abs(dx) + tcu::abs(dy));
				break;

			default:
				DE_ASSERT(false);
		}

		m_derivBias = tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f);
	}
}